

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedMatrix::Run(AdvancedMatrix *this)

{
  bool bVar1;
  GLuint GVar2;
  Vector<float,_3> local_288;
  Vector<float,_3> local_27c;
  Vector<float,_3> local_270;
  Vector<float,_3> local_264;
  undefined8 local_258;
  float data_2 [8];
  float data_1 [16];
  float data [92];
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedMatrix *this_local;
  
  glsl_vs = (char *)this;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,2)
  ;
  if (bVar1) {
    glsl_fs = 
    "\nlayout(location = 0) in vec4 g_position;\nout StageData {\n  flat int instance_id;\n} vs_out;\nlayout(binding = 0, std430) coherent buffer Buffer0 {\n  mat3x4 g_transform[4];\n  mat4x3 g_color;\n  mat3 g_data0;\n};\nlayout(binding = 1, std430) readonly buffer Buffer1 {\n  mat4 color;\n} g_buffer1;\nuniform int g_index1 = 1;\nuniform int g_index2 = 2;\nvoid main() {\n  gl_Position = vec4(transpose(g_transform[gl_InstanceID]) * g_position, 1);\n  g_color[gl_InstanceID] = g_buffer1.color[gl_InstanceID].rgb;\n  if (gl_VertexID == 0 && gl_InstanceID == 0) {\n    g_data0[1][1] = 1.0;\n    g_data0[g_index1][g_index2] += 3.0;\n  }\n  memoryBarrier();\n  vs_out.instance_id = gl_InstanceID;\n}"
    ;
    local_28 = 
    "\nin StageData {\n  flat int instance_id;\n} fs_in;\nlayout(location = 0) out vec4 g_ocolor;\nlayout(binding = 0, std430) coherent buffer Buffer0 {\n  mat3x4 g_transform[4];\n  mat4x3 g_color;\n  mat3 g_data0;\n};\nuniform int g_index1 = 1;\nuniform int g_index2 = 2;\nvoid main() {\n  if (g_data0[g_index1][g_index1] != 1.0) g_ocolor = vec4(0);\n  else if (g_data0[g_index1][g_index2] != 3.0) g_ocolor = vec4(0);\n  else g_ocolor = vec4(g_color[fs_in.instance_id], 1);\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "\nlayout(location = 0) in vec4 g_position;\nout StageData {\n  flat int instance_id;\n} vs_out;\nlayout(binding = 0, std430) coherent buffer Buffer0 {\n  mat3x4 g_transform[4];\n  mat4x3 g_color;\n  mat3 g_data0;\n};\nlayout(binding = 1, std430) readonly buffer Buffer1 {\n  mat4 color;\n} g_buffer1;\nuniform int g_index1 = 1;\nuniform int g_index2 = 2;\nvoid main() {\n  gl_Position = vec4(transpose(g_transform[gl_InstanceID]) * g_position, 1);\n  g_color[gl_InstanceID] = g_buffer1.color[gl_InstanceID].rgb;\n  if (gl_VertexID == 0 && gl_InstanceID == 0) {\n    g_data0[1][1] = 1.0;\n    g_data0[g_index1][g_index2] += 3.0;\n  }\n  memoryBarrier();\n  vs_out.instance_id = gl_InstanceID;\n}"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "\nin StageData {\n  flat int instance_id;\n} fs_in;\nlayout(location = 0) out vec4 g_ocolor;\nlayout(binding = 0, std430) coherent buffer Buffer0 {\n  mat3x4 g_transform[4];\n  mat4x3 g_color;\n  mat3 g_data0;\n};\nuniform int g_index1 = 1;\nuniform int g_index2 = 2;\nvoid main() {\n  if (g_data0[g_index1][g_index1] != 1.0) g_ocolor = vec4(0);\n  else if (g_data0[g_index1][g_index2] != 3.0) g_ocolor = vec4(0);\n  else g_ocolor = vec4(g_color[fs_in.instance_id], 1);\n}"
               ,(allocator<char> *)((long)data + 0x16f));
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_48,&local_80);
    this->m_program = GVar2;
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)data + 0x16f));
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,3,this->m_storage_buffer);
      memcpy(data_1 + 0xe,&DAT_02a16d10,0x170);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x170,data_1 + 0xe,0x88e4);
      memcpy(data_2 + 6,&DAT_02a16e80,0x40);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x40,data_2 + 6,0x88e4);
      local_258 = 0xbecccccdbecccccd;
      data_2[0] = 0.4;
      data_2[1] = -0.4;
      data_2[2] = -0.4;
      data_2[3] = 0.4;
      data_2[4] = 0.4;
      data_2[5] = 0.4;
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_buffer);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0x20,&local_258,0x88e4);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0);
      glu::CallLogWrapper::glBindTexture
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,this->m_rt);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x2801,0x2601);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x2800,0x2601);
      glu::CallLogWrapper::glTexStorage2D
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,1,0x8058,100,100);
      glu::CallLogWrapper::glBindTexture
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0);
      glu::CallLogWrapper::glViewport
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,100,100);
      glu::CallLogWrapper::glBindFramebuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8d40,this->m_fbo);
      glu::CallLogWrapper::glFramebufferTexture
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8d40,0x8ce0,this->m_rt,0);
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glVertexAttribPointer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,2,0x1406,'\0',0,(void *)0x0);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glClear
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x4000);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArraysInstanced
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,5,0,4,4);
      tcu::Vector<float,_3>::Vector(&local_264,1.0,0.0,0.0);
      tcu::Vector<float,_3>::Vector(&local_270,0.0,1.0,0.0);
      tcu::Vector<float,_3>::Vector(&local_27c,0.0,0.0,1.0);
      tcu::Vector<float,_3>::Vector(&local_288,1.0,1.0,0.0);
      bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                        (&this->super_ShaderStorageBufferObjectBase,&local_264,&local_270,&local_27c
                         ,&local_288,(int *)0x0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        this_local = (AdvancedMatrix *)0x0;
      }
      else {
        this_local = (AdvancedMatrix *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedMatrix *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedMatrix *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "out StageData {" NL "  flat int instance_id;" NL
			   "} vs_out;" NL "layout(binding = 0, std430) coherent buffer Buffer0 {" NL "  mat3x4 g_transform[4];" NL
			   "  mat4x3 g_color;" NL "  mat3 g_data0;" NL "};" NL
			   "layout(binding = 1, std430) readonly buffer Buffer1 {" NL "  mat4 color;" NL "} g_buffer1;" NL
			   "uniform int g_index1 = 1;" NL "uniform int g_index2 = 2;" NL "void main() {" NL
			   "  gl_Position = vec4(transpose(g_transform[gl_InstanceID]) * g_position, 1);" NL
			   "  g_color[gl_InstanceID] = g_buffer1.color[gl_InstanceID].rgb;" NL
			   "  if (gl_VertexID == 0 && gl_InstanceID == 0) {" NL "    g_data0[1][1] = 1.0;" NL
			   "    g_data0[g_index1][g_index2] += 3.0;" NL "  }" NL "  memoryBarrier();" NL
			   "  vs_out.instance_id = gl_InstanceID;" NL "}";

		const char* const glsl_fs =
			NL "in StageData {" NL "  flat int instance_id;" NL "} fs_in;" NL
			   "layout(location = 0) out vec4 g_ocolor;" NL "layout(binding = 0, std430) coherent buffer Buffer0 {" NL
			   "  mat3x4 g_transform[4];" NL "  mat4x3 g_color;" NL "  mat3 g_data0;" NL "};" NL
			   "uniform int g_index1 = 1;" NL "uniform int g_index2 = 2;" NL "void main() {" NL
			   "  if (g_data0[g_index1][g_index1] != 1.0) g_ocolor = vec4(0);" NL
			   "  else if (g_data0[g_index1][g_index2] != 3.0) g_ocolor = vec4(0);" NL
			   "  else g_ocolor = vec4(g_color[fs_in.instance_id], 1);" NL "}";

		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(3, m_storage_buffer);

		/* transform buffer */
		{
			float data[48 + 16 + 12 + 16] = {
				1.0f, 0.0f, 0.0f, -0.5f, 0.0f, 1.0f, 0.0f, -0.5f, 0.0f, 0.0f, 1.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.5f,
				0.0f, 1.0f, 0.0f, -0.5f, 0.0f, 0.0f, 1.0f, 0.0f,  1.0f, 0.0f, 0.0f, 0.5f, 0.0f, 1.0f, 0.0f, 0.5f,
				0.0f, 0.0f, 1.0f, 0.0f,  1.0f, 0.0f, 0.0f, -0.5f, 0.0f, 1.0f, 0.0f, 0.5f, 0.0f, 0.0f, 1.0f, 0.0f,
			};
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* transform buffer */
		{
			float data[16] = {
				1.0f, 0.0f, 0.0f, -0.5f, 0.0f, 1.0f, 0.0f, -0.5f, 0.0f, 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, 0.0f, 0.5f,
			};
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* vertex buffer */
		{
			float data[8] = { -0.4f, -0.4f, 0.4f, -0.4f, -0.4f, 0.4f, 0.4f, 0.4f };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glBindTexture(GL_TEXTURE_2D, m_rt);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 100, 100);
		glBindTexture(GL_TEXTURE_2D, 0);
		glViewport(0, 0, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_rt, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 4);

		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(0, 1, 0), vec3(0, 0, 1), vec3(1, 1, 0)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}